

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stock.cpp
# Opt level: O3

void __thiscall L10_1::Stock::show(Stock *this)

{
  uint uVar1;
  undefined8 uVar2;
  long lVar3;
  undefined8 in_RAX;
  ostream *poVar4;
  undefined8 uStack_38;
  
  lVar3 = std::cout;
  uVar1 = *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18));
  *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
       uVar1 & 0xfffffefb | 4;
  uVar2 = *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(lVar3 + -0x18));
  *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(lVar3 + -0x18)) = 3;
  uStack_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Company: ",9);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->company)._M_dataplus._M_p,
                      (this->company)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," Shares: ",9);
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," Shares Price: $",0x10);
  poVar4 = std::ostream::_M_insert<double>(this->share_val);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," Total worth: $",0xf);
  poVar4 = std::ostream::_M_insert<double>(this->total_val);
  uStack_38 = CONCAT17(10,(undefined7)uStack_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)((long)&uStack_38 + 7),1);
  lVar3 = std::cout;
  *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
       uVar1 & 0x104 |
       *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) &
       0xfffffefb;
  *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(lVar3 + -0x18)) = uVar2;
  return;
}

Assistant:

void Stock::show() {
    //  设置输出格式
    //  使用定点表示法，避免科学记数法
    std::ios_base::fmtflags origin_flag = std::cout.setf(std::ios_base::fixed, std::ios_base::floatfield);
    std::streamsize precision = std::cout.precision(3);

    std::cout << "Company: " << company << " Shares: " << shares << "\n";
    std::cout << " Shares Price: $" << share_val << " Total worth: $" << total_val << '\n';

    //  恢复之前设置的输出格式
    std::cout.setf(origin_flag, std::ios_base::floatfield);
    std::cout.precision(precision);
}